

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Leases.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Leases::revokePrefix
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Leases *this,Path *path,Parameters *parameters)

{
  Client *client;
  string local_88;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Url local_48;
  Parameters *local_28;
  Parameters *parameters_local;
  Path *path_local;
  Leases *this_local;
  
  client = *(Client **)this;
  local_28 = parameters;
  parameters_local = (Parameters *)path;
  path_local = (Path *)this;
  this_local = (Leases *)__return_storage_ptr__;
  Vault::operator+(&local_88,"revoke-prefix/",path);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_68,&local_88);
  getUrl(&local_48,this,&local_68);
  HttpConsumer::put(__return_storage_ptr__,client,&local_48,local_28);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_48);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Sys::Leases::revokePrefix(const Path &path,
                                 const Parameters &parameters) {
  return HttpConsumer::put(client_, getUrl(Path{"revoke-prefix/" + path}),
                           parameters);
}